

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer *
helics::emptyBlock(SmallBuffer *__return_storage_ptr__,DataType outputType,DataType inputType)

{
  double valval;
  undefined4 in_register_00000014;
  NamedPoint *this;
  NamedPoint *this_00;
  NamedPoint local_68;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  this = &local_68;
  this_00 = &local_68;
  switch(outputType) {
  case HELICS_STRING:
  case HELICS_CHAR:
    if (inputType == HELICS_VECTOR) {
      local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      helicsVectorString_abi_cxx11_
                (&local_68.name,(helics *)&local_38,
                 (vector<double,_std::allocator<double>_> *)CONCAT44(in_register_00000014,inputType)
                );
      local_20._M_len = local_68.name._M_string_length;
      local_20._M_str = local_68.name._M_dataplus._M_p;
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                (__return_storage_ptr__,&local_20);
      std::__cxx11::string::~string((string *)&local_68);
      this_00 = (NamedPoint *)&local_38;
      goto LAB_001f0c11;
    }
    if (inputType == HELICS_COMPLEX_VECTOR) {
      local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      helicsComplexVectorString_abi_cxx11_
                (&local_68.name,(helics *)&local_38,
                 (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 CONCAT44(in_register_00000014,inputType));
      local_20._M_len = local_68.name._M_string_length;
      local_20._M_str = local_68.name._M_dataplus._M_p;
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                (__return_storage_ptr__,&local_20);
      std::__cxx11::string::~string((string *)&local_68);
      this = (NamedPoint *)&local_38;
      goto LAB_001f0bc8;
    }
    if (inputType == HELICS_NAMED_POINT) goto switchD_001f0aa1_caseD_7;
    local_68.name._M_dataplus._M_p = (pointer)0x0;
    local_68.name._M_string_length = 0x35f754;
    goto LAB_001f0c26;
  default:
    local_68.name._M_dataplus._M_p = (pointer)0x0;
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&local_68);
    break;
  case HELICS_INT:
  case HELICS_TIME:
    local_68.name._M_dataplus._M_p = (pointer)0x0;
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&local_68);
    break;
  case HELICS_COMPLEX:
    local_68.name._M_dataplus._M_p = (pointer)0x0;
    local_68.name._M_string_length = 0;
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_68);
    break;
  case HELICS_VECTOR:
    local_68.name._M_dataplus._M_p = (pointer)0x0;
    local_68.name._M_string_length = 0;
    local_68.name.field_2._M_allocated_capacity = 0;
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_68);
LAB_001f0c11:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)this_00);
    break;
  case HELICS_COMPLEX_VECTOR:
    local_68.name._M_dataplus._M_p = (pointer)0x0;
    local_68.name._M_string_length = 0;
    local_68.name.field_2._M_allocated_capacity = 0;
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,
            (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_68);
LAB_001f0bc8:
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)this);
    break;
  case HELICS_NAMED_POINT:
    valval = nan("0");
    NamedPoint::NamedPoint(&local_68,(string_view)(ZEXT816(0x35f754) << 0x40),valval);
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    break;
  case HELICS_BOOL:
switchD_001f0aa1_caseD_7:
    local_68.name._M_dataplus._M_p = (pointer)0x1;
    local_68.name._M_string_length = 0x35c8a6;
LAB_001f0c26:
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_68)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer emptyBlock(DataType outputType, DataType inputType = DataType::HELICS_ANY)
{
    switch (outputType) {
        case DataType::HELICS_DOUBLE:
        default:
            return ValueConverter<double>::convert(0.0);
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(0);
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(std::complex<double>(0.0, 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert("0");
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(NamedPoint{"", std::nan("0")});
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            switch (inputType) {
                default:
                    return ValueConverter<std::string_view>::convert("");
                case DataType::HELICS_VECTOR:
                    return ValueConverter<std::string_view>::convert(
                        helicsVectorString(std::vector<double>()));
                case DataType::HELICS_COMPLEX_VECTOR:
                    return ValueConverter<std::string_view>::convert(
                        helicsComplexVectorString(std::vector<std::complex<double>>()));
                case DataType::HELICS_NAMED_POINT:
                    return ValueConverter<std::string_view>::convert("0");
            }
        case DataType::HELICS_COMPLEX_VECTOR: {
            return ValueConverter<std::vector<std::complex<double>>>::convert(
                std::vector<std::complex<double>>());
        }
        case DataType::HELICS_VECTOR:
            return ValueConverter<std::vector<double>>::convert(std::vector<double>());
    }
}